

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O0

void __thiscall squall::Klass<Foo,_void>::Klass(Klass<Foo,_void> *this,VM *vm,string *name)

{
  HSQUIRRELVM vm_00;
  HSQUIRRELVM name_00;
  undefined1 local_30 [24];
  string *name_local;
  VM *vm_local;
  Klass<Foo,_void> *this_local;
  
  this->vm_ = vm;
  local_30._16_8_ = name;
  name_local = (string *)vm;
  vm_local = (VM *)this;
  std::weak_ptr<squall::detail::KlassImp<Foo>_>::weak_ptr(&this->imp_);
  vm_00 = (HSQUIRRELVM)VM::klass_table((VM *)name_local);
  name_00 = VM::handle(this->vm_);
  KlassTable::add_klass<Foo,void>((KlassTable *)local_30,vm_00,(string *)name_00);
  std::weak_ptr<squall::detail::KlassImp<Foo>_>::operator=
            (&this->imp_,(weak_ptr<squall::detail::KlassImp<Foo>_> *)local_30);
  std::weak_ptr<squall::detail::KlassImp<Foo>_>::~weak_ptr
            ((weak_ptr<squall::detail::KlassImp<Foo>_> *)local_30);
  return;
}

Assistant:

Klass(VM& vm, const string& name) : vm_(vm) {
        imp_ = vm.klass_table().add_klass<C, Base>(vm_.handle(), name);
    }